

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktTessellationUserDefinedIO.cpp
# Opt level: O3

string * __thiscall
vkt::tessellation::(anonymous_namespace)::Variable::declare_abi_cxx11_
          (string *__return_storage_ptr__,void *this)

{
  long lVar1;
  long *plVar2;
  size_type *psVar3;
  long *local_1e0 [2];
  long local_1d0 [2];
  DeclareVariable local_1c0;
  ostringstream local_180 [112];
  ios_base local_110 [264];
  
  glu::decl::DeclareVariable::DeclareVariable
            (&local_1c0,(VarType *)((long)this + 0x28),(string *)((long)this + 8),0);
  std::__cxx11::ostringstream::ostringstream(local_180);
  glu::decl::operator<<((ostream *)local_180,&local_1c0);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream(local_180);
  std::ios_base::~ios_base(local_110);
  plVar2 = (long *)std::__cxx11::string::append((char *)local_1e0);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  psVar3 = (size_type *)(plVar2 + 2);
  if ((size_type *)*plVar2 == psVar3) {
    lVar1 = plVar2[3];
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar3;
    *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar1;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar2;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar3;
  }
  __return_storage_ptr__->_M_string_length = plVar2[1];
  *plVar2 = (long)psVar3;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  if (local_1e0[0] != local_1d0) {
    operator_delete(local_1e0[0],local_1d0[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c0.name._M_dataplus._M_p != &local_1c0.name.field_2) {
    operator_delete(local_1c0.name._M_dataplus._M_p,local_1c0.name.field_2._M_allocated_capacity + 1
                   );
  }
  glu::VarType::~VarType(&local_1c0.varType);
  return __return_storage_ptr__;
}

Assistant:

std::string Variable::declare (void) const
{
	DE_ASSERT(!m_isArray);
	return de::toString(glu::declare(m_type, m_name)) + ";\n";
}